

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTaskManager.hpp
# Opt level: O0

void __thiscall sftm::CTaskManager::Start(CTaskManager *this,uint32_t nInitWorkers)

{
  reference pvVar1;
  reference pvVar2;
  uint local_1c;
  uint local_18;
  uint32_t nWorker_1;
  uint32_t nWorker;
  uint32_t nInitWorkers_local;
  CTaskManager *this_local;
  
  nWorker_1 = nInitWorkers;
  if (0x40 < nInitWorkers) {
    nWorker_1 = 0x3f;
  }
  this->m_nWorkerCount = nWorker_1;
  for (local_18 = 0; local_18 <= nWorker_1; local_18 = local_18 + 1) {
    pvVar1 = std::array<sftm::CWorker,_64UL>::operator[](&this->m_workers,0);
    pvVar2 = std::array<sftm::CWorker,_64UL>::operator[](&this->m_workers,(ulong)local_18);
    (pvVar2->m_ownerData).m_pWorkers = pvVar1;
    pvVar1 = std::array<sftm::CWorker,_64UL>::operator[](&this->m_workers,(ulong)local_18);
    (pvVar1->m_ownerData).m_nWorkerCount = nWorker_1;
    pvVar1 = std::array<sftm::CWorker,_64UL>::operator[](&this->m_workers,(ulong)local_18);
    (pvVar1->m_ownerData).m_pCvWorkerIdle = &this->m_cvWorkerIdle;
    pvVar1 = std::array<sftm::CWorker,_64UL>::operator[](&this->m_workers,(ulong)local_18);
    (pvVar1->m_ownerData).m_pMutWorkerIdle = &this->m_mtxWorkerIdle;
  }
  for (local_1c = 1; local_1c <= nWorker_1; local_1c = local_1c + 1) {
    pvVar1 = std::array<sftm::CWorker,_64UL>::operator[](&this->m_workers,(ulong)local_1c);
    CWorker::Start(pvVar1);
  }
  return;
}

Assistant:

void Start(std::uint32_t nInitWorkers) noexcept
		{
			if (nInitWorkers > MAX_WORKERS)
				nInitWorkers = MAX_WORKERS - 1;
			m_nWorkerCount = nInitWorkers;

			for (std::uint32_t nWorker = 0; nWorker <= nInitWorkers; nWorker++)
			{
				m_workers[nWorker].m_ownerData.m_pWorkers		= &m_workers[0];
				m_workers[nWorker].m_ownerData.m_nWorkerCount	= nInitWorkers;
				m_workers[nWorker].m_ownerData.m_pCvWorkerIdle	= &m_cvWorkerIdle;
				m_workers[nWorker].m_ownerData.m_pMutWorkerIdle = &m_mtxWorkerIdle;
			}

			for (std::uint32_t nWorker = 1; nWorker <= nInitWorkers; nWorker++)
			{
				m_workers[nWorker].Start();
			}
		}